

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseMethodOptions
          (Parser *this,LocationRecorder *parent_location,FileDescriptorProto *containing_file,
          int optionsFieldNumber,Message *mutable_options)

{
  bool bVar1;
  undefined1 local_88 [8];
  LocationRecorder location;
  allocator local_59;
  string local_58;
  Message *local_38;
  Message *mutable_options_local;
  FileDescriptorProto *pFStack_28;
  int optionsFieldNumber_local;
  FileDescriptorProto *containing_file_local;
  LocationRecorder *parent_location_local;
  Parser *this_local;
  
  local_38 = mutable_options;
  mutable_options_local._4_4_ = optionsFieldNumber;
  pFStack_28 = containing_file;
  containing_file_local = (FileDescriptorProto *)parent_location;
  parent_location_local = (LocationRecorder *)this;
  ConsumeEndOfDeclaration(this,"{",parent_location);
  while( true ) {
    bVar1 = TryConsumeEndOfDeclaration(this,"}",(LocationRecorder *)0x0);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return true;
    }
    bVar1 = AtEnd(this);
    if (bVar1) break;
    bVar1 = TryConsumeEndOfDeclaration(this,";",(LocationRecorder *)0x0);
    if (!bVar1) {
      LocationRecorder::LocationRecorder
                ((LocationRecorder *)local_88,(LocationRecorder *)containing_file_local,
                 mutable_options_local._4_4_);
      bVar1 = ParseOption(this,local_38,(LocationRecorder *)local_88,pFStack_28,OPTION_STATEMENT);
      if (!bVar1) {
        SkipStatement(this);
      }
      LocationRecorder::~LocationRecorder((LocationRecorder *)local_88);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_58,"Reached end of input in method options (missing \'}\').",&local_59
            );
  AddError(this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  return false;
}

Assistant:

bool Parser::ParseMethodOptions(const LocationRecorder& parent_location,
                                const FileDescriptorProto* containing_file,
                                const int optionsFieldNumber,
                                Message* mutable_options) {
  // Options!
  ConsumeEndOfDeclaration("{", &parent_location);
  while (!TryConsumeEndOfDeclaration("}", NULL)) {
    if (AtEnd()) {
      AddError("Reached end of input in method options (missing '}').");
      return false;
    }

    if (TryConsumeEndOfDeclaration(";", NULL)) {
      // empty statement; ignore
    } else {
      LocationRecorder location(parent_location, optionsFieldNumber);
      if (!ParseOption(mutable_options, location, containing_file,
                       OPTION_STATEMENT)) {
        // This statement failed to parse.  Skip it, but keep looping to
        // parse other statements.
        SkipStatement();
      }
    }
  }

  return true;
}